

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  uint size;
  Node *block;
  int iVar1;
  TValue *pTVar2;
  Node *pNVar3;
  uint local_64;
  TValue *io2;
  TValue *io1;
  Node *old;
  Node *nold;
  int oldhsize;
  uint oldasize;
  AuxsetnodeT asn;
  int j;
  uint i;
  uint nhsize_local;
  uint nasize_local;
  Table *t_local;
  lua_State *L_local;
  
  size = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (size < nasize) {
    setarrayvector(L,t,nasize);
  }
  _oldhsize = t;
  asn.t._0_4_ = nhsize;
  iVar1 = luaD_rawrunprotected(L,auxsetnode,&oldhsize);
  if (iVar1 != 0) {
    setarrayvector(L,t,size);
    luaD_throw(L,4);
  }
  asn.nhsize = local_64;
  if (nasize < size) {
    t->sizearray = nasize;
    for (asn._12_4_ = nasize; (uint)asn._12_4_ < size; asn._12_4_ = asn._12_4_ + 1) {
      if (t->array[(uint)asn._12_4_].tt_ != 0) {
        luaH_setint(L,t,(ulong)(asn._12_4_ + 1),t->array + (uint)asn._12_4_);
      }
    }
    pTVar2 = (TValue *)luaM_realloc_(L,t->array,(ulong)size << 4,(ulong)nasize << 4);
    t->array = pTVar2;
  }
  do {
    do {
      do {
        do {
          asn.nhsize = asn.nhsize - 1;
          if ((int)asn.nhsize < 0) {
            if (0 < (int)local_64) {
              luaM_realloc_(L,block,(long)(int)local_64 << 5,0);
            }
            return;
          }
          pNVar3 = block + (int)asn.nhsize;
        } while ((pNVar3->i_val).tt_ == 0);
        pTVar2 = luaH_set(L,t,&(pNVar3->i_key).tvk);
        pTVar2->value_ = (pNVar3->i_val).value_;
        pTVar2->tt_ = (pNVar3->i_val).tt_;
      } while ((pTVar2->tt_ & 0x8000) == 0);
      if ((pTVar2->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x1c5,"void luaH_resize(lua_State *, Table *, unsigned int, unsigned int)");
      }
      if ((pTVar2->tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) goto LAB_00156c82;
    } while (L == (lua_State *)0x0);
    if ((pTVar2->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x1c5,"void luaH_resize(lua_State *, Table *, unsigned int, unsigned int)");
    }
  } while ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) == 0);
LAB_00156c82:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                ,0x1c5,"void luaH_resize(lua_State *, Table *, unsigned int, unsigned int)");
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}